

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Mem * out2Prerelease(Vdbe *p,VdbeOp *pOp)

{
  Mem *pOut;
  
  pOut = p->aMem + pOp->p2;
  if ((p->aMem[pOp->p2].flags & 0x9000) == 0) {
    pOut->flags = 4;
  }
  else {
    out2PrereleaseWithClear(pOut);
  }
  return pOut;
}

Assistant:

static Mem *out2Prerelease(Vdbe *p, VdbeOp *pOp){
  Mem *pOut;
  assert( pOp->p2>0 );
  assert( pOp->p2<=(p->nMem+1 - p->nCursor) );
  pOut = &p->aMem[pOp->p2];
  memAboutToChange(p, pOut);
  if( VdbeMemDynamic(pOut) ){ /*OPTIMIZATION-IF-FALSE*/
    return out2PrereleaseWithClear(pOut);
  }else{
    pOut->flags = MEM_Int;
    return pOut;
  }
}